

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrTransformTest(Vec_Ptr_t *vDes)

{
  Abc_Frame_t *pAVar1;
  Mio_Library_t *pLib;
  Vec_Ptr_t *vGatesNames;
  Vec_Ptr_t *vDes_00;
  void **ppvVar2;
  size_t sVar3;
  char *__dest;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  
  Bac_PtrDumpBlif("test1.blif",vDes);
  pAVar1 = Abc_FrameGetGlobalFrame();
  if (pAVar1 == (Abc_Frame_t *)0x0) {
    pcVar7 = "ABC framework is not started.";
  }
  else {
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if (pLib != (Mio_Library_t *)0x0) {
      vGatesNames = Bac_ManCollectGateNamesByTruth(pLib);
      iVar9 = vDes->nSize;
      uVar6 = (ulong)iVar9;
      if ((long)uVar6 < 0) {
        __assert_fail("nCap >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
      }
      vDes_00 = (Vec_Ptr_t *)malloc(0x10);
      vDes_00->nCap = iVar9;
      if (iVar9 != 0) {
        ppvVar2 = (void **)malloc(uVar6 << 3);
        vDes_00->pArray = ppvVar2;
        pcVar7 = (char *)*vDes->pArray;
        if (pcVar7 == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          sVar3 = strlen(pcVar7);
          __dest = (char *)malloc(sVar3 + 1);
          strcpy(__dest,pcVar7);
        }
        vDes_00->nSize = 1;
        *ppvVar2 = __dest;
        if (iVar9 != 1) {
          lVar8 = 1;
          iVar9 = 2;
          do {
            pVVar4 = Bac_PtrTransformNtk((Vec_Ptr_t *)vDes->pArray[lVar8],vGatesNames);
            iVar5 = (int)uVar6;
            if ((int)lVar8 == iVar5) {
              if (iVar5 < 0x10) {
                if (vDes_00->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(0x80);
                }
                else {
                  ppvVar2 = (void **)realloc(vDes_00->pArray,0x80);
                }
                vDes_00->pArray = ppvVar2;
                vDes_00->nCap = 0x10;
                uVar6 = 0x10;
              }
              else {
                uVar6 = (ulong)(uint)(iVar5 * 2);
                if (vDes_00->pArray == (void **)0x0) {
                  ppvVar2 = (void **)malloc(uVar6 * 8);
                }
                else {
                  ppvVar2 = (void **)realloc(vDes_00->pArray,uVar6 * 8);
                }
                vDes_00->pArray = ppvVar2;
                vDes_00->nCap = iVar5 * 2;
              }
            }
            else {
              ppvVar2 = vDes_00->pArray;
            }
            vDes_00->nSize = iVar9;
            ppvVar2[lVar8] = pVVar4;
            lVar8 = lVar8 + 1;
            iVar9 = iVar9 + 1;
          } while (lVar8 < vDes->nSize);
        }
        Bac_PtrDumpBlif("test2.blif",vDes_00);
        if (vGatesNames->pArray != (void **)0x0) {
          free(vGatesNames->pArray);
        }
        free(vGatesNames);
        return vDes_00;
      }
      vDes_00->pArray = (void **)0x0;
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pcVar7 = "Standard cell library is not entered.";
  }
  puts(pcVar7);
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformTest( Vec_Ptr_t * vDes )
{
    Mio_Library_t * pLib;
    Vec_Ptr_t * vGatesNames;
    Vec_Ptr_t * vNtk, * vNew; int i;
    // dump BLIF before transformation
    Bac_PtrDumpBlif( "test1.blif", vDes );
    if ( Abc_FrameGetGlobalFrame() == NULL )
    {
        printf( "ABC framework is not started.\n" );
        return NULL;
    }
    pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    if ( pLib == NULL )
    {
        printf( "Standard cell library is not entered.\n" );
        return NULL;
    }
    vGatesNames = Bac_ManCollectGateNamesByTruth( pLib );
    // transform
    vNew = Vec_PtrAllocExact( Vec_PtrSize(vDes) );
    Vec_PtrPush( vNew, Abc_UtilStrsav((char *)Vec_PtrEntry(vDes, 0)) );
    Vec_PtrForEachEntryStart( Vec_Ptr_t *, vDes, vNtk, i, 1 )
        Vec_PtrPush( vNew, Bac_PtrTransformNtk(vNtk, vGatesNames) );
    // dump BLIF after transformation
    Bac_PtrDumpBlif( "test2.blif", vNew );
    Vec_PtrFree( vGatesNames );
    return vNew;
}